

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestApp.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  long lVar2;
  NetworkConfig config;
  Server WebServer;
  
  config.interfaceNumber = 1;
  http::Server::Server(&WebServer);
  printf("%d bit build\n",0x40);
  lVar2 = 1;
  while( true ) {
    if (argc <= lVar2) {
      http::Server::RegisterPageHandler(&WebServer,ProcessPageRequest);
      osThread::Create(&NetworkThread,NetworkEntry,"Network",0x400,10,&config);
      usleep(1000000);
      osEvent::Wait(&StartEvent,
                    "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test_app/TestApp.cpp"
                    ,0x16c,-1);
      http::Server::Initialize(&WebServer,(InterfaceMAC *)&tcpStack,&tcpStack.TCP,0x50);
      DefaultStack::StartDHCP(&tcpStack);
      do {
        usleep(100000);
        DefaultStack::Tick(&tcpStack);
      } while( true );
    }
    __s1 = argv[lVar2];
    iVar1 = strcmp(__s1,"-devices");
    if (iVar1 == 0) break;
    iVar1 = strcmp(__s1,"-use");
    if (iVar1 != 0) {
      printf("unknown option \'%s\'\n",__s1);
      iVar1 = -1;
      goto LAB_00104218;
    }
    config.interfaceNumber = atoi(argv[lVar2 + 1]);
    lVar2 = lVar2 + 2;
  }
  iVar1 = 0;
  PacketIO::DisplayDevices();
LAB_00104218:
  http::Server::~Server(&WebServer);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
    NetworkConfig config;
    config.interfaceNumber = 1;
    http::Server WebServer;

    printf("%d bit build\n", (sizeof(void*) == 4 ? 32 : 64));

    // Start at 1 to skip the file name
    for (int i = 1; i < argc; i++)
    {
        if (!strcmp(argv[i], "-devices"))
        {
            PacketIO::DisplayDevices();
            return 0;
        }
        else if (!strcmp(argv[i], "-use"))
        {
            config.interfaceNumber = atoi(argv[++i]);
        }
        else
        {
            printf("unknown option '%s'\n", argv[i]);
            return -1;
        }
    }

    WebServer.RegisterPageHandler(ProcessPageRequest);
    NetworkThread.Create(NetworkEntry, "Network", 1024, 10, &config);

#ifdef _WIN32
    Sleep(1000);
#elif __linux__
    usleep(1000000);
#endif
    StartEvent.Wait(__FILE__, __LINE__);

    WebServer.Initialize(tcpStack.MAC, tcpStack.TCP, 80);

    tcpStack.StartDHCP();

    while (1)
    {
#ifdef _WIN32
        Sleep(100);
#elif __linux__
        usleep(100000);
#endif
        tcpStack.Tick();
    }
}